

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O0

long vec3::random(void)

{
  vec3 *in_RDI;
  double in_XMM0_Qa;
  double e0;
  double e1;
  double e2;
  double in_XMM1_Qa;
  double max_local;
  double min_local;
  
  e0 = random_double(in_XMM0_Qa,in_XMM1_Qa);
  e1 = random_double(in_XMM0_Qa,in_XMM1_Qa);
  e2 = random_double(in_XMM0_Qa,in_XMM1_Qa);
  vec3(in_RDI,e0,e1,e2);
  return (long)in_RDI;
}

Assistant:

static vec3 random(double min, double max) {
        return vec3(random_double(min,max), random_double(min,max), random_double(min,max));
    }